

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  SourceLineInfo *pSVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  domain_error *pdVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar8;
  undefined1 local_2c0 [8];
  ostringstream oss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined8 uStack_2a0;
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  size_t local_278;
  string local_148;
  string local_128;
  SourceLineInfo local_108;
  string local_e0;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  TagAliasRegistry *local_a0;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  size_t local_58;
  SourceLineInfo *local_48;
  char *local_40;
  allocator local_32;
  allocator local_31;
  
  local_a0 = this;
  local_40 = alias;
  std::__cxx11::string::string((string *)local_2c0,alias,(allocator *)local_c0);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"[@","");
  local_48 = lineInfo;
  bVar4 = startsWith((string *)local_2c0,(string *)local_98);
  bVar5 = true;
  if (bVar4) {
    std::__cxx11::string::string((string *)&local_148,local_40,&local_32);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"]","");
    bVar5 = endsWith(&local_148,&local_e0);
    bVar5 = !bVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  if (local_2c0 != (undefined1  [8])&local_2b0) {
    operator_delete((void *)local_2c0);
  }
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c0,"error: tag alias, \"",0x13);
    poVar6 = std::operator<<((ostream *)local_2c0,local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\" is not of the form [@alias name].\n",0x24);
    operator<<(poVar6,local_48);
    pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(pdVar7,(char *)local_98._0_8_);
    __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::string((string *)&local_128,tag,(allocator *)local_c0);
  pSVar3 = local_48;
  paVar1 = &local_108.file.field_2;
  pcVar2 = (local_48->file)._M_dataplus._M_p;
  local_108.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar2,pcVar2 + (local_48->file)._M_string_length);
  local_108.line = pSVar3->line;
  TagAlias::TagAlias((TagAlias *)local_98,&local_128,&local_108);
  local_2c0 = (undefined1  [8])local_40;
  if ((undefined1 *)local_98._0_8_ == local_98 + 0x10) {
    uStack_2a0 = local_98._24_8_;
    _oss = local_2b0._M_local_buf + 8;
  }
  else {
    _oss = (pointer)local_98._0_8_;
  }
  local_2b0._M_allocated_capacity = local_98._8_8_;
  local_98._8_8_ = 0;
  local_98[0x10] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p == &local_68) {
    local_288._8_8_ = local_68._8_8_;
    local_298._M_p = (pointer)&local_288;
  }
  else {
    local_298._M_p = local_78._M_p;
  }
  local_290 = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_278 = local_58;
  local_98._0_8_ = local_98 + 0x10;
  local_78._M_p = (pointer)&local_68;
  pVar8 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::_M_emplace_unique<std::pair<char_const*,Catch::TagAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                      *)&local_a0->m_registry,(pair<const_char_*,_Catch::TagAlias> *)local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_p != &local_288) {
    operator_delete(local_298._M_p);
  }
  if (_oss != local_2b0._M_local_buf + 8) {
    operator_delete(_oss);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c0,"error: tag alias, \"",0x13);
    poVar6 = std::operator<<((ostream *)local_2c0,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" already registered.\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tFirst seen at ",0xf);
    std::__cxx11::string::string((string *)local_c0,local_40,&local_31);
    (*(local_a0->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(local_98,local_a0,local_c0);
    operator<<(poVar6,(SourceLineInfo *)(local_98._0_8_ + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tRedefined at ",0xe);
    operator<<(poVar6,local_48);
    Option<Catch::TagAlias>::reset((Option<Catch::TagAlias> *)local_98);
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0]);
    }
    pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(pdVar7,(char *)local_98._0_8_);
    __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return;
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }